

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

int lgx_type_cmp_function(lgx_type_function_t *t1,lgx_type_function_t *t2)

{
  int iVar1;
  uint local_24;
  int i;
  lgx_type_function_t *t2_local;
  lgx_type_function_t *t1_local;
  
  if ((t1->receiver).type == T_UNKNOWN) {
    if ((t2->receiver).type != T_UNKNOWN) {
      return 1;
    }
  }
  else {
    iVar1 = lgx_type_cmp(&t1->receiver,&t2->receiver);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if ((t1->ret).type == T_UNKNOWN) {
    if ((t2->ret).type != T_UNKNOWN) {
      return 1;
    }
  }
  else {
    iVar1 = lgx_type_cmp(&t1->ret,&t2->ret);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (t1->arg_len == t2->arg_len) {
    for (local_24 = 0; local_24 < t1->arg_len; local_24 = local_24 + 1) {
      iVar1 = lgx_type_cmp(t1->args + (int)local_24,t2->args + (int)local_24);
      if (iVar1 != 0) {
        return 1;
      }
    }
    t1_local._4_4_ = 0;
  }
  else {
    t1_local._4_4_ = 1;
  }
  return t1_local._4_4_;
}

Assistant:

int lgx_type_cmp_function(lgx_type_function_t* t1, lgx_type_function_t* t2) {
    if (t1->receiver.type == T_UNKNOWN) {
        if (t2->receiver.type != T_UNKNOWN) {
            return 1;
        }
    } else {
        if (lgx_type_cmp(&t1->receiver, &t2->receiver)) {
            return 1;
        }
    }

    if (t1->ret.type == T_UNKNOWN) {
        if (t2->ret.type != T_UNKNOWN) {
            return 1;
        }
    } else {
        if (lgx_type_cmp(&t1->ret, &t2->ret)) {
            return 1;
        }
    }

    if (t1->arg_len != t2->arg_len) {
        return 1;
    }

    int i;
    for (i = 0; i < t1->arg_len; ++i) {
        if (lgx_type_cmp(&t1->args[i], &t2->args[i])) {
            return 1;
        }
    }

    return 0;
}